

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::CheckResourceAvailability(cmCTestMultiProcessHandler *this)

{
  int index;
  bool bVar1;
  mapped_type *errors;
  undefined1 local_60 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  allocations;
  pair<const_int,_cmCTestMultiProcessHandler::TestInfo> *t;
  iterator __end2;
  iterator __begin2;
  TestMap *__range2;
  cmCTestMultiProcessHandler *this_local;
  
  if ((this->UseResourceSpec & 1U) != 0) {
    __end2 = std::
             map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
             ::begin(&(this->PendingTests).
                      super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                    );
    t = (pair<const_int,_cmCTestMultiProcessHandler::TestInfo> *)
        std::
        map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
        ::end(&(this->PendingTests).
               super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
             );
    while (bVar1 = std::operator!=(&__end2,(_Self *)&t), bVar1) {
      allocations._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   _Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>::
                   operator*(&__end2);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
             *)local_60);
      index = *(int *)allocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
      errors = std::
               map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError>_>_>_>_>_>
               ::operator[](&this->ResourceAvailabilityErrors,
                            (key_type_conflict1 *)
                            allocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      TryAllocateResources
                (this,index,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
                  *)local_60,errors);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
              *)local_60);
      std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResourceAvailability()
{
  if (this->UseResourceSpec) {
    for (auto const& t : this->PendingTests) {
      std::map<std::string, std::vector<cmCTestBinPackerAllocation>>
        allocations;
      this->TryAllocateResources(t.first, allocations,
                                 &this->ResourceAvailabilityErrors[t.first]);
    }
  }
}